

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_prng.c
# Opt level: O0

int lj_prng_seed_secure(PRNGState *rs)

{
  int __fd;
  long lVar1;
  ssize_t sVar2;
  ssize_t n;
  int fd;
  PRNGState *rs_local;
  
  lVar1 = syscall(0x13e,rs,0x20,0);
  if (lVar1 == 0x20) {
LAB_0011d2fb:
    if (rs->u[0] < 2) {
      rs->u[0] = rs->u[0] + 2;
    }
    if (rs->u[1] < 0x40) {
      rs->u[1] = rs->u[1] + 0x40;
    }
    if (rs->u[2] < 0x200) {
      rs->u[2] = rs->u[2] + 0x200;
    }
    if (rs->u[3] < 0x20000) {
      rs->u[3] = rs->u[3] + 0x20000;
    }
    lj_prng_u64(rs);
    rs_local._4_4_ = 1;
  }
  else {
    __fd = open64("/dev/urandom",0x80000);
    if (__fd != -1) {
      sVar2 = read(__fd,rs,0x20);
      close(__fd);
      if (sVar2 == 0x20) goto LAB_0011d2fb;
    }
    rs_local._4_4_ = 0;
  }
  return rs_local._4_4_;
}

Assistant:

int LJ_FASTCALL lj_prng_seed_secure(PRNGState *rs)
{
#if LJ_TARGET_XBOX360

  if (XNetRandom(rs->u, (unsigned int)sizeof(rs->u)) == 0)
    goto ok;

#elif LJ_TARGET_PS3

  if (sys_get_random_number(rs->u, sizeof(rs->u)) == 0)
    goto ok;

#elif LJ_TARGET_PS4 || LJ_TARGET_PSVITA

  if (sceRandomGetRandomNumber(rs->u, sizeof(rs->u)) == 0)
    goto ok;

#elif LJ_TARGET_UWP || LJ_TARGET_XBOXONE

  if (BCryptGenRandom(NULL, (PUCHAR)(rs->u), (ULONG)sizeof(rs->u),
		      BCRYPT_USE_SYSTEM_PREFERRED_RNG) >= 0)
    goto ok;

#elif LJ_TARGET_WINDOWS

  /* Keep the library loaded in case multiple VMs are started. */
  if (!libfunc_rgr) {
    HMODULE lib = LJ_WIN_LOADLIBA("advapi32.dll");
    if (!lib) return 0;
    libfunc_rgr = (PRGR)GetProcAddress(lib, "SystemFunction036");
    if (!libfunc_rgr) return 0;
  }
  if (libfunc_rgr(rs->u, (ULONG)sizeof(rs->u)))
    goto ok;

#elif LJ_TARGET_POSIX

#if LJ_TARGET_LINUX && defined(SYS_getrandom)

  if (syscall(SYS_getrandom, rs->u, sizeof(rs->u), 0) == (long)sizeof(rs->u))
    goto ok;

#elif LJ_TARGET_HAS_GETENTROPY

#ifdef __ELF__
  if (&getentropy && getentropy(rs->u, sizeof(rs->u)) == 0)
    goto ok;
#else
  if (getentropy(rs->u, sizeof(rs->u)) == 0)
    goto ok;
#endif

#endif

  /* Fallback to /dev/urandom. This may fail if the device is not
  ** existent or accessible in a chroot or container, or if the process
  ** or the OS ran out of file descriptors.
  */
  {
    int fd = open("/dev/urandom", O_RDONLY|O_CLOEXEC);
    if (fd != -1) {
      ssize_t n = read(fd, rs->u, sizeof(rs->u));
      (void)close(fd);
      if (n == (ssize_t)sizeof(rs->u))
	goto ok;
    }
  }

#else

  /* Add an elif above for your OS with a secure PRNG seed.
  ** Note that fiddling around with rand(), getpid(), time() or coercing
  ** ASLR to yield a few bits of randomness is not helpful.
  ** If you don't want any security, then don't pretend you have any
  ** and simply define LUAJIT_SECURITY_PRNG=0 for the build.
  */
#error "Missing secure PRNG seed for this OS"

#endif
  return 0;  /* Fail. */

ok:
  lj_prng_condition(rs);
  (void)lj_prng_u64(rs);
  return 1;  /* Success. */
}